

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_MASS_BANISH(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  monster *mon_00;
  uint local_34;
  monster *mon;
  uint dam;
  wchar_t radius;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  if (context->radius == 0) {
    local_34 = (uint)z_info->max_sight;
  }
  else {
    local_34 = context->radius;
  }
  mon._4_4_ = L'\0';
  context->ident = true;
  if ((player->upkeep->arena_level & 1U) == 0) {
    for (dam = 1; wVar2 = cave_monster_max(cave), (int)dam < wVar2; dam = dam + 1) {
      mon_00 = (monster *)cave_monster(cave,dam);
      if (((mon_00->race != (monster_race *)0x0) && (_Var1 = monster_is_unique(mon_00), !_Var1)) &&
         ((int)(uint)mon_00->cdis <= (int)local_34)) {
        delete_monster_idx((chunk *)cave,dam);
        uVar3 = Rand_div(3);
        mon._4_4_ = uVar3 + 1 + mon._4_4_;
      }
    }
    wVar2 = player_apply_damage_reduction(player,mon._4_4_);
    if ((wVar2 != L'\0') && (((player->opts).opt[3] & 1U) != 0)) {
      msg("You take %d damage.\n",(ulong)(uint)wVar2);
    }
    take_hit(player,wVar2,"the strain of casting Mass Banishment");
    player->upkeep->redraw = player->upkeep->redraw | 0x400000;
  }
  else {
    msg("Nothing happens.");
  }
  return true;
}

Assistant:

bool effect_handler_MASS_BANISH(effect_handler_context_t *context)
{
	int i;
	int radius = context->radius ? context->radius : z_info->max_sight;
	unsigned dam = 0;

	context->ident = true;

	/* Don't allow in an arena. */
	if (player->upkeep->arena_level) {
		msg("Nothing happens.");
		return true;
	}

	/* Delete the (nearby) monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Paranoia -- Skip dead monsters */
		if (!mon->race) continue;

		/* Hack -- Skip unique monsters */
		if (monster_is_unique(mon)) continue;

		/* Skip distant monsters */
		if (mon->cdis > radius) continue;

		/* Delete the monster */
		delete_monster_idx(cave, i);

		/* Take some damage */
		dam += randint1(3);
	}

	/* Hurt the player */
	dam = player_apply_damage_reduction(player, dam);
	if (dam > 0 && OPT(player, show_damage)) {
		msg("You take %d damage.\n", dam);
	}
	take_hit(player, dam, "the strain of casting Mass Banishment");

	/* Update monster list window */
	player->upkeep->redraw |= PR_MONLIST;

	return true;
}